

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

bool __thiscall
GF2::MP<137UL,_GF2::MOGrlex<137UL>_>::operator!=(MP<137UL,_GF2::MOGrlex<137UL>_> *this,bool cRight)

{
  bool bVar1;
  size_t sVar2;
  WW<137UL> *this_00;
  byte in_SIL;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  byte bVar3;
  
  if ((in_SIL & 1) == 0) {
    sVar2 = Size((MP<137UL,_GF2::MOGrlex<137UL>_> *)0x1b31c7);
    bVar3 = sVar2 != 0;
  }
  else {
    sVar2 = Size((MP<137UL,_GF2::MOGrlex<137UL>_> *)0x1b317d);
    bVar3 = 1;
    if (sVar2 == 1) {
      std::__cxx11::list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>::begin
                ((list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *)
                 CONCAT17(1,CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)));
      this_00 = &std::_List_const_iterator<GF2::MM<137UL>_>::operator->
                           ((_List_const_iterator<GF2::MM<137UL>_> *)0x1b31a5)->super_WW<137UL>;
      bVar1 = WW<137UL>::IsAllZero(this_00);
      bVar3 = bVar1 ^ 0xff;
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool operator!=(bool cRight) const
	{	
		return cRight ? Size() != 1 || !begin()->IsAllZero() : Size() != 0;
	}